

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBar.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBar::ComputeInternalForces(ChElementBar *this,ChVectorDynamic<> *Fi)

{
  double *__dest;
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  double *__dest_00;
  double dVar4;
  double dVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  ChVector<double> int_forceB;
  ChVector<double> int_forceA;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  undefined8 uStack_20;
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 6) {
    __assert_fail("Fi.size() == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBar.cpp"
                  ,0x5e,
                  "virtual void chrono::fea::ChElementBar::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar11 = *(double *)&peVar3->field_0x28 - *(double *)&peVar2->field_0x28;
  dVar4 = *(double *)&(peVar3->super_ChNodeFEAbase).field_0x20 -
          *(double *)&(peVar2->super_ChNodeFEAbase).field_0x20;
  dVar5 = *(double *)&peVar3->field_0x30 - *(double *)&peVar2->field_0x30;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar4;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar11 * dVar11;
  auVar12 = vfmadd231sd_fma(auVar15,auVar12,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar5;
  auVar12 = vfmadd231sd_fma(auVar12,auVar13,auVar13);
  auVar12 = vsqrtsd_avx(auVar12,auVar12);
  bVar6 = 2.2250738585072014e-308 <= auVar12._0_8_;
  dVar14 = 1.0 / auVar12._0_8_;
  local_48 = (double)((ulong)bVar6 * (long)(dVar4 * dVar14) + (ulong)!bVar6 * 0x3ff0000000000000);
  local_28 = (double)((ulong)bVar6 * (long)(dVar11 * dVar14));
  uStack_20 = 0;
  dVar11 = (double)((ulong)bVar6 * (long)(dVar5 * dVar14));
  uStack_40 = 0x3ff0000000000000;
  uStack_30 = 0;
  local_38 = dVar11;
  (*(this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase[0x17])();
  local_60 = dVar11 * local_48;
  local_58 = dVar11 * local_28;
  local_50 = dVar11 * local_38;
  local_78 = dVar11 * -local_48;
  local_70 = dVar11 * -local_28;
  local_68 = dVar11 * -local_38;
  uVar8 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar8 < 3) goto LAB_0069a462;
  __dest_00 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar9 = 3;
  if (((ulong)__dest_00 & 7) == 0) {
    uVar7 = -((uint)((ulong)__dest_00 >> 3) & 0x1fffffff) & 7;
    if (uVar7 < 3) {
      uVar9 = uVar7;
    }
    if (uVar7 != 0) goto LAB_0069a3c7;
  }
  else {
LAB_0069a3c7:
    memcpy(__dest_00,&local_60,(ulong)(uVar9 * 8));
  }
  if (uVar9 < 3) {
    uVar10 = (ulong)(uVar9 << 3);
    memcpy((void *)((long)__dest_00 + uVar10),(void *)((long)&local_60 + uVar10),0x18 - uVar10);
  }
  if (uVar8 < 6) {
LAB_0069a462:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  __dest = __dest_00 + 3;
  uVar9 = 3;
  if (((ulong)__dest & 7) == 0) {
    uVar7 = -((uint)((ulong)__dest >> 3) & 0x1fffffff) & 7;
    if (uVar7 < 3) {
      uVar9 = uVar7;
    }
    if (uVar7 == 0) goto LAB_0069a438;
  }
  memcpy(__dest,&local_78,(ulong)(uVar9 * 8));
LAB_0069a438:
  if (uVar9 < 3) {
    uVar8 = (ulong)(uVar9 << 3);
    memcpy((void *)((long)__dest_00 + uVar8 + 0x18),(void *)((long)&local_78 + uVar8),0x18 - uVar8);
  }
  return;
}

Assistant:

void ChElementBar::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 6);

	ChVector<> dir = (nodes[1]->GetPos() - nodes[0]->GetPos()).GetNormalized();
	double internal_force_local = GetCurrentForce();
    ChVector<> int_forceA = dir * internal_force_local;
    ChVector<> int_forceB = -dir * internal_force_local;

    Fi.segment(0, 3) = int_forceA.eigen();
    Fi.segment(3, 3) = int_forceB.eigen();
}